

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.h
# Opt level: O0

void __thiscall crnlib::ktx_texture::clear(ktx_texture *this)

{
  vector<crnlib::vector<unsigned_char>_> *in_RDI;
  
  ktx_header::clear((ktx_header *)0x176ea8);
  vector<crnlib::vector<unsigned_char>_>::clear(in_RDI);
  vector<crnlib::vector<unsigned_char>_>::clear(in_RDI);
  *(undefined4 *)&in_RDI[6].m_p = 0;
  *(undefined4 *)((long)&in_RDI[6].m_p + 4) = 0;
  *(undefined1 *)&in_RDI[6].m_size = 0;
  return;
}

Assistant:

void clear() {
    m_header.clear();
    m_key_values.clear();
    m_image_data.clear();

    m_block_dim = 0;
    m_bytes_per_block = 0;

    m_opposite_endianness = false;
  }